

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rbbi.cpp
# Opt level: O3

LanguageBreakEngine * __thiscall
icu_63::RuleBasedBreakIterator::getLanguageBreakEngine(RuleBasedBreakIterator *this,UChar32 c)

{
  code *pcVar1;
  UBool UVar2;
  int iVar3;
  ulong in_RAX;
  LanguageBreakEngine *pLVar4;
  UStack *pUVar5;
  ICULanguageBreakFactory *this_00;
  long *plVar6;
  UnhandledEngine *pUVar7;
  undefined4 in_register_00000034;
  code *pcVar8;
  code *pcVar9;
  int32_t iVar10;
  UErrorCode status;
  undefined8 local_28;
  
  pcVar8 = (code *)&local_28;
  pcVar1 = (code *)(ulong)(uint)c;
  local_28 = in_RAX & 0xffffffff00000000;
  pUVar5 = this->fLanguageBreakEngines;
  pcVar9 = (code *)CONCAT44(in_register_00000034,c);
  if (pUVar5 != (UStack *)0x0) {
LAB_00294e25:
    iVar10 = (pUVar5->super_UVector).count;
    while (0 < iVar10) {
      iVar10 = iVar10 + -1;
      pLVar4 = (LanguageBreakEngine *)
               UVector::elementAt(&this->fLanguageBreakEngines->super_UVector,iVar10);
      pcVar9 = pcVar1;
      iVar3 = (*pLVar4->_vptr_LanguageBreakEngine[2])(pLVar4);
      if ((char)iVar3 != '\0') {
        return pLVar4;
      }
    }
    if ((gLanguageBreakFactoriesInitOnce.fState.super___atomic_base<int>._M_i != 2) &&
       (UVar2 = umtx_initImplPreInit(&gLanguageBreakFactoriesInitOnce), UVar2 != '\0')) {
      local_28 = local_28 & 0xffffffff;
      pUVar5 = (UStack *)UMemory::operator_new((UMemory *)0x28,(size_t)pcVar9);
      if (pUVar5 == (UStack *)0x0) {
        gLanguageBreakFactories = (UStack *)0x0;
      }
      else {
        pcVar9 = _deleteFactory;
        UStack::UStack(pUVar5,_deleteFactory,(UElementsAreEqual *)0x0,
                       (UErrorCode *)((long)&local_28 + 4));
        gLanguageBreakFactories = pUVar5;
        if (local_28._4_4_ < 1) {
          this_00 = (ICULanguageBreakFactory *)UMemory::operator_new((UMemory *)0x10,(size_t)pcVar9)
          ;
          if (this_00 != (ICULanguageBreakFactory *)0x0) {
            ICULanguageBreakFactory::ICULanguageBreakFactory
                      (this_00,(UErrorCode *)((long)&local_28 + 4));
          }
          UVector::addElement(&gLanguageBreakFactories->super_UVector,this_00,
                              (UErrorCode *)((long)&local_28 + 4));
        }
      }
      pcVar9 = rbbi_cleanup;
      ucln_common_registerCleanup_63(UCLN_COMMON_RBBI,rbbi_cleanup);
      umtx_initImplPostInit(&gLanguageBreakFactoriesInitOnce);
    }
    if (gLanguageBreakFactories != (UStack *)0x0) {
      iVar10 = (gLanguageBreakFactories->super_UVector).count;
      while (0 < iVar10) {
        iVar10 = iVar10 + -1;
        plVar6 = (long *)UVector::elementAt(&gLanguageBreakFactories->super_UVector,iVar10);
        pcVar9 = pcVar1;
        pLVar4 = (LanguageBreakEngine *)(**(code **)(*plVar6 + 0x10))(plVar6);
        if (pLVar4 != (LanguageBreakEngine *)0x0) {
          UVector::addElement(&this->fLanguageBreakEngines->super_UVector,pLVar4,
                              (UErrorCode *)&local_28);
          return pLVar4;
        }
      }
    }
    pUVar7 = this->fUnhandledBreakEngine;
    if (pUVar7 == (UnhandledEngine *)0x0) {
      pUVar7 = (UnhandledEngine *)UMemory::operator_new((UMemory *)0x10,(size_t)pcVar9);
      if (pUVar7 == (UnhandledEngine *)0x0) {
        this->fUnhandledBreakEngine = (UnhandledEngine *)0x0;
        if ((UErrorCode)local_28 < U_ILLEGAL_ARGUMENT_ERROR) {
          return (LanguageBreakEngine *)0x0;
        }
      }
      else {
        UnhandledEngine::UnhandledEngine(pUVar7,(UErrorCode *)&local_28);
        this->fUnhandledBreakEngine = pUVar7;
      }
      UVector::insertElementAt
                (&this->fLanguageBreakEngines->super_UVector,pUVar7,0,(UErrorCode *)&local_28);
      pUVar7 = this->fUnhandledBreakEngine;
      if (U_ZERO_ERROR < (UErrorCode)local_28) {
        if (pUVar7 != (UnhandledEngine *)0x0) {
          (*(pUVar7->super_LanguageBreakEngine)._vptr_LanguageBreakEngine[1])();
        }
        this->fUnhandledBreakEngine = (UnhandledEngine *)0x0;
        return (LanguageBreakEngine *)0x0;
      }
    }
    (*(pUVar7->super_LanguageBreakEngine)._vptr_LanguageBreakEngine[4])(pUVar7,pcVar1);
    return &this->fUnhandledBreakEngine->super_LanguageBreakEngine;
  }
  pUVar5 = (UStack *)UMemory::operator_new((UMemory *)0x28,(size_t)CONCAT44(in_register_00000034,c))
  ;
  if (pUVar5 == (UStack *)0x0) {
    this->fLanguageBreakEngines = (UStack *)0x0;
  }
  else {
    UStack::UStack(pUVar5,(UErrorCode *)&local_28);
    this->fLanguageBreakEngines = pUVar5;
    pcVar9 = pcVar8;
    if ((UErrorCode)local_28 < U_ILLEGAL_ARGUMENT_ERROR) goto LAB_00294e25;
    (*(pUVar5->super_UVector).super_UObject._vptr_UObject[1])(pUVar5);
  }
  this->fLanguageBreakEngines = (UStack *)0x0;
  return (LanguageBreakEngine *)0x0;
}

Assistant:

const LanguageBreakEngine *
RuleBasedBreakIterator::getLanguageBreakEngine(UChar32 c) {
    const LanguageBreakEngine *lbe = NULL;
    UErrorCode status = U_ZERO_ERROR;

    if (fLanguageBreakEngines == NULL) {
        fLanguageBreakEngines = new UStack(status);
        if (fLanguageBreakEngines == NULL || U_FAILURE(status)) {
            delete fLanguageBreakEngines;
            fLanguageBreakEngines = 0;
            return NULL;
        }
    }

    int32_t i = fLanguageBreakEngines->size();
    while (--i >= 0) {
        lbe = (const LanguageBreakEngine *)(fLanguageBreakEngines->elementAt(i));
        if (lbe->handles(c)) {
            return lbe;
        }
    }

    // No existing dictionary took the character. See if a factory wants to
    // give us a new LanguageBreakEngine for this character.
    lbe = getLanguageBreakEngineFromFactory(c);

    // If we got one, use it and push it on our stack.
    if (lbe != NULL) {
        fLanguageBreakEngines->push((void *)lbe, status);
        // Even if we can't remember it, we can keep looking it up, so
        // return it even if the push fails.
        return lbe;
    }

    // No engine is forthcoming for this character. Add it to the
    // reject set. Create the reject break engine if needed.
    if (fUnhandledBreakEngine == NULL) {
        fUnhandledBreakEngine = new UnhandledEngine(status);
        if (U_SUCCESS(status) && fUnhandledBreakEngine == NULL) {
            status = U_MEMORY_ALLOCATION_ERROR;
            return nullptr;
        }
        // Put it last so that scripts for which we have an engine get tried
        // first.
        fLanguageBreakEngines->insertElementAt(fUnhandledBreakEngine, 0, status);
        // If we can't insert it, or creation failed, get rid of it
        if (U_FAILURE(status)) {
            delete fUnhandledBreakEngine;
            fUnhandledBreakEngine = 0;
            return NULL;
        }
    }

    // Tell the reject engine about the character; at its discretion, it may
    // add more than just the one character.
    fUnhandledBreakEngine->handleCharacter(c);

    return fUnhandledBreakEngine;
}